

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O3

bool __thiscall Confparse::WriteStr(Confparse *this,char *key,char *value)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  byte *pbVar5;
  path *this_00;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte bVar9;
  path nfn;
  ofstream file;
  char buf [1024];
  path local_2a60;
  undefined1 local_2a38 [248];
  ios_base local_2940 [264];
  char local_2838 [10248];
  
  pbVar8 = (byte *)this->conf;
  if (pbVar8 != (byte *)0x0) {
    if (key == (char *)0x0) {
      return false;
    }
    if (value == (char *)0x0) {
      return false;
    }
    if ((this->filepath)._M_pathname._M_string_length == 0) {
      return false;
    }
    sVar4 = strlen(key);
    iVar6 = (int)sVar4;
    if (iVar6 != 0) {
      pbVar5 = (byte *)strstr((char *)pbVar8,key);
      if (pbVar5 != (byte *)0x0) {
        pbVar1 = (byte *)this->limit;
        if (pbVar5 < pbVar1) {
          do {
            if (pbVar5 + iVar6 < pbVar1) {
              bVar9 = pbVar5[iVar6];
              iVar3 = isalnum((int)(char)bVar9);
              if (iVar3 == 0) {
                pbVar7 = pbVar5 + (long)iVar6 + 1;
                while ((bVar9 < 0x3e && ((0x2000000100000200U >> ((ulong)bVar9 & 0x3f) & 1) != 0)))
                {
                  if (pbVar1 <= pbVar7) goto LAB_0010cccf;
                  bVar9 = *pbVar7;
                  pbVar7 = pbVar7 + 1;
                }
                pbVar7 = pbVar7 + -1;
                if ((pbVar8 <= pbVar7) &&
                   (((pbVar5 == pbVar8 || (pbVar5[-1] == 0xd)) || (pbVar5[-1] == 10))))
                goto LAB_0010cd44;
              }
            }
LAB_0010cccf:
            pbVar5 = (byte *)strstr((char *)(pbVar5 + 1),key);
          } while ((pbVar5 != (byte *)0x0) && (pbVar5 < pbVar1));
        }
        std::ofstream::ofstream(local_2a38);
        std::ofstream::open(local_2a38,(_Ios_Openmode)(this->filepath)._M_pathname._M_dataplus._M_p)
        ;
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 != '\0') {
          snprintf(local_2838,0x2800,"%s = %s\r\n",key,value);
          strlen(local_2838);
          std::ostream::write(local_2a38,(long)local_2838);
          std::ostream::flush();
          std::ofstream::close();
          Load(this,&this->filepath,false);
        }
        local_2a38._0_8_ = _VTT;
        *(undefined8 *)(local_2a38 + *(long *)(_VTT + -0x18)) = _roundf;
        std::filebuf::~filebuf((filebuf *)(local_2a38 + 8));
        std::ios_base::~ios_base(local_2940);
        return (bool)cVar2;
      }
      std::filesystem::__cxx11::path::path(&local_2a60,&this->filepath);
      std::filesystem::__cxx11::path::_M_concat(&local_2a60,1,"~");
      std::ofstream::ofstream(local_2a38);
      std::filesystem::rename(&this->filepath,&local_2a60);
      std::ofstream::open(local_2a38,(_Ios_Openmode)(this->filepath)._M_pathname._M_dataplus._M_p);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        std::ostream::write(local_2a38,(long)this->conf);
        snprintf(local_2838,0x400,"\r\n%s = %s",key,value);
        std::ostream::write(local_2a38,(long)local_2838);
        std::ostream::flush();
        std::ofstream::close();
        Load(this,&this->filepath,false);
      }
      local_2a38._0_8_ = _VTT;
      *(undefined8 *)(local_2a38 + *(long *)(_VTT + -0x18)) = _roundf;
      std::filebuf::~filebuf((filebuf *)(local_2a38 + 8));
      std::ios_base::~ios_base(local_2940);
      this_00 = &local_2a60;
      goto LAB_0010d031;
    }
  }
  return false;
  while (pbVar7 = pbVar7 + 1, pbVar8 = pbVar1, pbVar7 < pbVar1) {
LAB_0010cd44:
    if ((*pbVar7 < 0xe) && (pbVar8 = pbVar7, (0x2401U >> (*pbVar7 & 0x1f) & 1) != 0)) break;
  }
  std::filesystem::__cxx11::path::path((path *)local_2a38,&this->filepath);
  std::filesystem::__cxx11::path::_M_concat((path *)local_2a38,1,"~");
  std::ofstream::ofstream(local_2838);
  std::filesystem::rename(&this->filepath,(path *)local_2a38);
  std::ofstream::open(local_2838,(_Ios_Openmode)(this->filepath)._M_pathname._M_dataplus._M_p);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    std::ostream::write(local_2838,(long)this->conf);
    strlen(value);
    std::ostream::write(local_2838,(long)value);
    std::ostream::write(local_2838,(long)pbVar8);
    std::ofstream::close();
    Load(this,&this->filepath,false);
  }
  std::ofstream::~ofstream(local_2838);
  this_00 = (path *)local_2a38;
LAB_0010d031:
  std::filesystem::__cxx11::path::~path(this_00);
  return (bool)cVar2;
}

Assistant:

bool Confparse::WriteStr(const char *key, const char *value) {
	char *p, *op;
	char *llimit;
	int keylen;

	if (!conf) return false;
	if (filepath.empty()) return false;
	if (!value) return false;
	if (!key) return false;

	keylen = strlen(key);
	if (keylen == 0) return false;
	op = p = strstr(conf, key);
	if (p == NULL) {
		char buf[1024];
		size_t bs;
		auto nfn = filepath;
		nfn += "~";
		ofstream file;

		filesystem::rename(filepath, nfn);
		file.open(filepath, std::ios::out | std::ios::binary | std::ios::trunc);
		if (!file.is_open()) {
			return false;
		}
		file.write(conf, buffer_size); // write the leadup
		bs = snprintf(buf, sizeof(buf), "\r\n%s = %s", key, value);
		file.write(buf, bs);
		file.flush();
		file.close();

		Load(filepath);
		return true;
	}

	//	llimit = limit - keylen - 2; // allows for up to 'key=x'
	llimit = limit;
	while (p && p < llimit) {

		/*
		 * Consume the name<whitespace>=<whitespace> trash before we
		 * get to the actual value.  While this does mean things are
		 * slightly less strict in the configuration file text it can
		 * assist in making it easier for people to read it.
		 */
		p = p + keylen;
		if ((p < llimit) && (!isalnum(*p))) {

			while ((p < llimit) && ((*p == '=') || (*p == ' ') || (*p == '\t'))) {
				p++; // get up to the start of the value;
			}

			if ((p < llimit) && (p >= conf)) {

				/*
				 * Check that the location of the strstr() return is
				 * left aligned to the start of the line. This prevents
				 * us picking up trash name=value pairs among the general
				 * text within the file
				 */
				if ((op == conf) || (*(op - 1) == '\r') || (*(op - 1) == '\n')) {
					char *ep = NULL;

					/*
					 * op represents the start of the line/key.
					 * p represents the start of the value.
					 *
					 * we can just dump out to the file up to p and then
					 * print our data
					 */

					/*
					 * Search for the end of the data by finding the end of the line
					 * This will become 'ep', which we'll use as the start of the
					 * rest of the file data we dump back to the config.
					 */
					ep = p;
					while ((ep < limit) && ((*ep != '\0') && (*ep != '\n') && (*ep != '\r'))) {
						ep++;
					}

					{
						auto nfn = filepath;
						nfn += "~";
						ofstream file;

						filesystem::rename(filepath, nfn);
						file.open(filepath, std::ios::out | std::ios::binary | std::ios::trunc);
						if (!file.is_open()) {
							return false;
						}
						file.write(conf, (p - conf));     // write the leadup
						file.write(value, strlen(value)); // write the new data
						file.write(ep, limit - ep);       // write the rest of the file
						file.close();

						Load(filepath);
						return true;
					}
				}
			}
		}
		p  = strstr(op + 1, key);
		op = p;
	}

	/*
	 * If we didn't find our parameter in the config file, then add it.
	 */
	{
		char sep[CONFPARSE_MAX_VALUE_SIZE];
		ofstream file;
		file.open(filepath, std::ios::out | std::ios::binary | std::ios::app);
		if (!file.is_open()) {
			return false;
		}
		snprintf(sep, sizeof(sep), "%s = %s\r\n", key, value);
		file.write(sep, strlen(sep));
		file.flush();
		file.close();

		Load(filepath);
		return true;
	}

	return false;
}